

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# attr.c
# Opt level: O0

void recursive_encode(attr_list l,AttrBuffer b,attr_value_type t)

{
  undefined8 *puVar1;
  uint uVar2;
  void *__dest;
  undefined8 *puVar3;
  undefined4 *puVar4;
  size_t sVar5;
  undefined2 *puVar6;
  int in_EDX;
  attr_list in_RSI;
  short *in_RDI;
  int i_1;
  int pad_len;
  int len;
  void *value;
  void *buffer_end_1;
  attr_p attr;
  int i;
  void *buffer_end;
  int attr_count;
  ulong in_stack_ffffffffffffffa8;
  undefined4 in_stack_ffffffffffffffb0;
  undefined4 in_stack_ffffffffffffffb4;
  int iVar7;
  int local_44;
  char *local_40;
  int local_24;
  undefined8 in_stack_ffffffffffffffe0;
  undefined4 in_stack_ffffffffffffffe8;
  
  if (*in_RDI == 0) {
    if (in_EDX == 1) {
      uVar2 = (uint)*(byte *)(*(long *)(in_RDI + 8) + 1);
      if (uVar2 != 0) {
        __dest = add_to_tmp_buffer((AttrBuffer)
                                   CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),
                                   (uint)(in_stack_ffffffffffffffa8 >> 0x20));
        memcpy(__dest,(void *)(*(long *)(in_RDI + 8) + 4),(long)(int)uVar2 << 3);
        *(char *)(*(long *)in_RSI + 1) = *(char *)(*(long *)in_RSI + 1) + (char)uVar2;
      }
    }
    else {
      for (local_24 = 0; local_24 < (int)(uint)*(byte *)(*(long *)(in_RDI + 8) + 2);
          local_24 = local_24 + 1) {
        puVar1 = (undefined8 *)(*(long *)(in_RDI + 4) + (long)local_24 * 0x18);
        puVar3 = (undefined8 *)
                 add_to_tmp_buffer((AttrBuffer)
                                   CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),
                                   (uint)(in_stack_ffffffffffffffa8 >> 0x20));
        *puVar3 = *puVar1;
        in_stack_ffffffffffffffa8 = (ulong)*(uint *)((long)puVar1 + 4);
        switch(in_stack_ffffffffffffffa8) {
        case 0:
        case 1:
        case 7:
        case 9:
          __assert_fail("0",
                        "/workspace/llm4binary/github/license_c_cmakelists/ornladios[P]ADIOS2/thirdparty/atl/atl/attr.c"
                        ,0x6a0,"void recursive_encode(attr_list, AttrBuffer, attr_value_type)");
        case 2:
          puVar3 = (undefined8 *)
                   add_to_tmp_buffer((AttrBuffer)
                                     CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),0
                                    );
          *puVar3 = puVar1[1];
          break;
        case 3:
        case 4:
          if (*(int *)((long)puVar1 + 4) == 3) {
            local_40 = (char *)puVar1[1];
            sVar5 = strlen(local_40);
            local_44 = (int)sVar5 + 1;
          }
          else {
            local_40 = (char *)puVar1[2];
            local_44 = *(int *)(puVar1 + 1);
          }
          puVar6 = (undefined2 *)
                   add_to_tmp_buffer((AttrBuffer)
                                     CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),0
                                    );
          *puVar6 = (short)local_44;
          memcpy(puVar6 + 1,local_40,(long)local_44);
          break;
        case 5:
          puVar4 = (undefined4 *)
                   add_to_tmp_buffer((AttrBuffer)
                                     CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),0
                                    );
          *puVar4 = *(undefined4 *)(puVar1 + 1);
          break;
        case 6:
          __assert_fail("0",
                        "/workspace/llm4binary/github/license_c_cmakelists/ornladios[P]ADIOS2/thirdparty/atl/atl/attr.c"
                        ,0x6c1,"void recursive_encode(attr_list, AttrBuffer, attr_value_type)");
        case 8:
          puVar3 = (undefined8 *)
                   add_to_tmp_buffer((AttrBuffer)
                                     CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),0
                                    );
          *puVar3 = puVar1[1];
        }
        *(char *)(*(long *)in_RSI + 2) = *(char *)(*(long *)in_RSI + 2) + '\x01';
      }
    }
  }
  else {
    for (iVar7 = 0; iVar7 < *(int *)(in_RDI + 4); iVar7 = iVar7 + 1) {
      recursive_encode(in_RSI,(AttrBuffer)CONCAT44(in_EDX,in_stack_ffffffffffffffe8),
                       (attr_value_type)((ulong)in_stack_ffffffffffffffe0 >> 0x20));
    }
  }
  return;
}

Assistant:

static void
recursive_encode(attr_list l, AttrBuffer b, attr_value_type t)
{
    if (l->list_of_lists == 0) {
	switch (t) {
	case Attr_Int4: {
	    /* marshalling only int4 attributes in this pass */
	    int attr_count = l->l.list.iattrs->int_attr_count;
	    void *buffer_end;
	    if (attr_count == 0) return;
	    buffer_end = add_to_tmp_buffer(b, (unsigned)(attr_count * 
					   sizeof(int_attr)));
	    memcpy(buffer_end, &l->l.list.iattrs->iattr[0], 
		   attr_count * sizeof(int_attr));
	    ((int_attr_p) b->tmp_buffer)->int_attr_count += attr_count;
	    break;
	  }
	default: {
	    /* no bulk stuff here... marshal one by one */
	    int i;
	    for (i=0; i<l->l.list.iattrs->other_attr_count; i++) {
		attr_p attr = &l->l.list.attributes[i];
		void *buffer_end = add_to_tmp_buffer(b, 8);
		memcpy(buffer_end, attr, 8);
		switch (attr->val_type) {
		case Attr_Int4:
		case Attr_Undefined:
		case Attr_Float16:
		case Attr_Float4:
		    assert(0);
		    break;
		case Attr_Atom:
		    buffer_end = add_to_tmp_buffer(b, 4);
		    *((int*)buffer_end) = (int) (long)attr->value.u.i;
		    break;
		case Attr_Int8:
		    buffer_end = add_to_tmp_buffer(b, 8);
		    memcpy(buffer_end, &attr->value.u.l, 8);
		    break;
		case Attr_Float8:
		    buffer_end = add_to_tmp_buffer(b, 8);
		    memcpy(buffer_end, &attr->value, 8);
		    break;
		case Attr_Opaque:
		case Attr_String: {
		    void *value;
		    int len;
		    int pad_len;
		    if (attr->val_type == Attr_String) {
			value = (char*) attr->value.u.p;
			len = (int)strlen((char*)value) + 1;
		    } else {
			value = attr->value.u.o.buffer;
			len = attr->value.u.o.length;
		    }
		    pad_len = roundup4(len+2) - 2;
		    buffer_end = add_to_tmp_buffer(b, 2 + pad_len);
		    *((int2*)buffer_end) = (int2) len;
		    memcpy((char*)buffer_end + 2, value, len);
		    break;
		  }
		case Attr_List:
		    assert(0);
		    break;
		}
		((int_attr_p) b->tmp_buffer)->other_attr_count ++;
	    }
	  }
	}
    } else {
        int i;
        for (i=0; i<l->l.lists.sublist_count; i++) {
	    recursive_encode(l, b, t);
	}
    }
}